

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5f52c::CtorEvalExternalInterface::applyToModule(CtorEvalExternalInterface *this)

{
  __node_base_ptr *pp_Var1;
  char **this_00;
  pointer puVar2;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var3;
  EvallingModuleRunner *pEVar4;
  Global *pGVar5;
  _Hash_node_base *p_Var6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  undefined1 auVar9 [8];
  char *pcVar10;
  Const *pCVar11;
  long lVar12;
  mapped_type *__x;
  Expression *pEVar13;
  _Rb_tree_node_base *p_Var14;
  iterator iVar15;
  InsertOrderedSet<wasm::Name> *this_01;
  Module *pMVar16;
  bool isPassive;
  Expression **ppEVar17;
  pointer puVar18;
  size_t sVar19;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *oldGlobal;
  pointer puVar20;
  pointer puVar21;
  _Node_conflict *__tmp;
  Name memory;
  Name possibleDefiningGlobal;
  Name name;
  Name NVar22;
  undefined1 auVar23 [16];
  string_view sVar24;
  Name global;
  Builder builder;
  __node_base_ptr p_Stack_1f8;
  _List_base<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>
  local_1f0;
  undefined1 auStack_1d8 [8];
  InitScanner scanner;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  local_a8;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_90 [3];
  undefined1 auStack_78 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  readableGlobals;
  
  std::
  _Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_(anonymous_namespace)::CtorEvalExternalInterface::DefiningGlobalInfo>,_std::allocator<std::pair<wasm::GCData_*const,_(anonymous_namespace)::CtorEvalExternalInterface::DefiningGlobalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->definingGlobals)._M_h);
  if ((this->startBlock).super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._M_engaged == true) {
    (((this->startBlock).super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._M_payload._M_value)->list).
    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements = 0;
  }
  if ((this->memories)._M_h._M_element_count != 0) {
    pMVar16 = this->wasm;
    puVar2 = (pMVar16->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar20 = (pMVar16->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (puVar20 ==
        (pMVar16->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      global.super_IString.str._M_str = (char *)pMVar16;
      auVar23 = wasm::IString::interned(0,"",0);
      memory.super_IString.str._M_len = auVar23._8_8_;
      pcVar10 = (char *)wasm::IString::interned(0,"",0);
      memory.super_IString.str._M_str = pcVar10;
      name.super_IString.str._M_str = auVar23._0_8_;
      name.super_IString.str._M_len = (size_t)auStack_78;
      wasm::Builder::makeDataSegment
                (name,memory,isPassive,(Expression *)0x0,(char *)0x0,(Address)0x15f1cf);
      wasm::Literal::makeFromInt32
                ((Literal *)auStack_1d8,0,
                 (Type)*(uintptr_t *)
                        ((long)(puVar2->_M_t).
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t + 0x50));
      pCVar11 = wasm::Builder::makeConst
                          ((Builder *)&global.super_IString.str._M_str,(Literal *)auStack_1d8);
      *(Const **)((long)auStack_78 + 0x30) = pCVar11;
      wasm::Literal::~Literal((Literal *)auStack_1d8);
      auVar9 = auStack_78;
      sVar24 = (string_view)wasm::Name::fromInt(0);
      (((Named *)auVar9)->name).super_IString.str = sVar24;
      ((Named *)auVar9)->hasExplicitName = false;
      _Var3._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (puVar2->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
           _M_t;
      pcVar10 = *(char **)((long)_Var3._M_t.
                                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                 .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      (((Name *)((long)auStack_78 + 0x18))->super_IString).str._M_len =
           *(size_t *)
            _Var3._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      (((Name *)((long)auStack_78 + 0x18))->super_IString).str._M_str = pcVar10;
      wasm::Module::addDataSegment((unique_ptr *)this->wasm);
      if (auStack_78 != (undefined1  [8])0x0) {
        std::default_delete<wasm::DataSegment>::operator()
                  ((default_delete<wasm::DataSegment> *)auStack_78,(DataSegment *)auStack_78);
      }
      puVar20 = (this->wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if (((puVar20->_M_t).
         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
         super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
         super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset->_id != ConstId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
    }
    lVar12 = wasm::Literal::getInteger();
    if (lVar12 != 0) {
      __assert_fail("segment->offset->cast<Const>()->value.getInteger() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                    ,0x20b,
                    "void (anonymous namespace)::CtorEvalExternalInterface::applyMemoryToModule()");
    }
    __x = std::__detail::
          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&this->memories,
                       (key_type *)
                       (puVar2->_M_t).
                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t)
    ;
    std::vector<char,_std::allocator<char>_>::operator=
              (&((puVar20->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->data,__x);
  }
  pMVar16 = this->wasm;
  if (((pMVar16->features).features & 0x400) == 0) {
    pEVar4 = this->instance;
    for (p_Var14 = (pEVar4->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
                   globals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var14 !=
        &(pEVar4->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals._M_t.
         _M_impl.super__Rb_tree_header;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      pEVar13 = getSerialization(this,(Literals *)&p_Var14[1]._M_left,(Name)ZEXT816(0));
      NVar22.super_IString.str._M_str = *(char **)(p_Var14 + 1);
      NVar22.super_IString.str._M_len = (size_t)this->wasm;
      lVar12 = wasm::Module::getGlobal(NVar22);
      *(Expression **)(lVar12 + 0x40) = pEVar13;
    }
  }
  else {
    local_a8.
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pMVar16->globals).
         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a8.
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pMVar16->globals).
         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_a8.
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pMVar16->globals).
         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pMVar16->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pMVar16->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pMVar16->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wasm::Module::updateMaps();
    puVar18 = local_a8.
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar21 = local_a8.
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar18;
        puVar21 = puVar21 + 1) {
      pGVar5 = (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if ((pGVar5->mutable_ == false) && ((pGVar5->type).id == (pGVar5->init->type).id)) {
        sVar19 = *(size_t *)&(pGVar5->super_Importable).super_Named;
        pcVar10 = (pGVar5->super_Importable).super_Named.name.super_IString.str._M_str;
      }
      else {
        pcVar10 = (char *)0x0;
        sVar19 = 0;
      }
      iVar15 = std::
               _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
               ::find(&(this->instance->
                       super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals.
                       _M_t,(key_type *)pGVar5);
      if ((_Rb_tree_header *)iVar15._M_node !=
          &(this->instance->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
           globals._M_t._M_impl.super__Rb_tree_header) {
        possibleDefiningGlobal.super_IString.str._M_str = pcVar10;
        possibleDefiningGlobal.super_IString.str._M_len = sVar19;
        pEVar13 = getSerialization(this,(Literals *)&iVar15._M_node[1]._M_left,
                                   possibleDefiningGlobal);
        ((puVar21->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init = pEVar13;
      }
      wasm::Module::addGlobal((unique_ptr *)this->wasm);
    }
    global.super_IString.str._M_str = (char *)&p_Stack_1f8;
    p_Stack_1f8 = (__node_base_ptr)0x0;
    local_1f0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1f0;
    local_1f0._M_impl._M_node._M_size = 0;
    pMVar16 = this->wasm;
    puVar18 = (pMVar16->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    scanner.unfixableGets.List.
    super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node._M_size
         = (size_t)(pMVar16->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_1f0._M_impl._M_node.super__List_node_base._M_prev =
         local_1f0._M_impl._M_node.super__List_node_base._M_next;
    if (puVar18 !=
        (pointer)scanner.unfixableGets.List.
                 super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl.
                 _M_node._M_size) {
      pp_Var1 = &scanner.unfixableGets.Map._M_h._M_single_bucket;
      this_00 = &global.super_IString.str._M_str;
      do {
        if (((puVar18->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init != (Expression *)0x0)
        {
          auStack_1d8 = (undefined1  [8])0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep = (Expression **)0x0
          ;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currFunction =
               (Function *)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].currp
               = (Expression **)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currModule =
               (Module *)&scanner.unfixableGets.Map._M_h._M_rehash_policy._M_next_resize;
          scanner.unfixableGets.Map._M_h._M_buckets = (__buckets_ptr)0x1;
          scanner.unfixableGets.Map._M_h._M_bucket_count = 0;
          scanner.unfixableGets.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          scanner.unfixableGets.Map._M_h._M_element_count._0_4_ = 0x3f800000;
          scanner.unfixableGets.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          scanner.unfixableGets.Map._M_h._M_rehash_policy._4_4_ = 0;
          scanner.unfixableGets.Map._M_h._M_rehash_policy._M_next_resize = 0;
          scanner.unfixableGets.List.
          super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node.
          super__List_node_base._M_prev = (_List_node_base *)0x0;
          scanner.unfixableGets.Map._M_h._M_single_bucket = (__node_base_ptr)pp_Var1;
          scanner.unfixableGets.List.
          super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node.
          super__List_node_base._M_next = (_List_node_base *)pp_Var1;
          wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                    ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)auStack_1d8,
                     wasm::PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::scan,
                     &((puVar18->_M_t).
                       super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                       super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init);
          while (p_Var8 = scanner.unfixableGets.Map._M_h._M_single_bucket,
                ((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                       super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                 (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                       _M_elems[9].currp >> 4) +
                (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep != 0) {
            if ((pointer)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[9].currp ==
                scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep ==
                  (Expression **)0x0) {
                pcVar10 = 
                "T &wasm::SmallVector<wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::Task, 10>::back() [T = wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::Task, N = 10]"
                ;
                goto LAB_00142e30;
              }
              ppEVar17 = scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[(long)scanner.
                                        super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                        .
                                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                        .replacep + -2].currp;
              auStack_1d8 = (undefined1  [8])
                            scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                            fixed._M_elems
                            [(long)scanner.
                                   super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                   super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                   replacep + -1].func;
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep =
                   (Expression **)
                   ((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep + -1
                   );
            }
            else {
              ppEVar17 = (Expression **)
                         scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible
                         .
                         super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].func;
              auStack_1d8 = (undefined1  [8])
                            scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                            flexible.
                            super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].currp;
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                   super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                   super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
            }
            if ((Expression *)(((element_type *)auStack_1d8)->tag).super_IString.str._M_len ==
                (Expression *)0x0) {
              pcVar10 = 
              "void wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::walk(Expression *&) [SubType = InitScanner, VisitorType = wasm::Visitor<InitScanner>]"
              ;
              goto LAB_00142dfa;
            }
            (*(code *)ppEVar17)((InitScanner *)auStack_1d8,(Expression **)auStack_1d8);
          }
          for (; p_Var7 = scanner.unfixableGets.Map._M_h._M_single_bucket,
              p_Var8 != (__node_base_ptr)pp_Var1; p_Var8 = p_Var8->_M_nxt) {
            p_Var6 = p_Var8[2]._M_nxt;
            wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::operator[]
                      ((InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)this_00,
                       (Name *)(puVar18->_M_t).
                               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                               .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
            this_01 = wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::
                      operator[]((InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>
                                  *)this_00,(Name *)(p_Var6 + 2));
            wasm::InsertOrderedSet<wasm::Name>::insert
                      (this_01,(Name *)(puVar18->_M_t).
                                       super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                       .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
          }
          while (p_Var7 != (__node_base_ptr)pp_Var1) {
            p_Var6 = p_Var7->_M_nxt;
            operator_delete(p_Var7,0x18);
            p_Var7 = p_Var6;
          }
          std::
          _Hashtable<wasm::GlobalGet_*,_std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<wasm::GlobalGet_*,_std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currModule
                       );
          if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].
              currp != (Expression **)0x0) {
            operator_delete(scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                            fixed._M_elems[9].currp,
                            (long)scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .flexible.
                                  super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .fixed._M_elems[9].currp);
          }
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 !=
               (pointer)scanner.unfixableGets.List.
                        super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>.
                        _M_impl._M_node._M_size);
      pMVar16 = this->wasm;
    }
    auStack_78 = (undefined1  [8])&readableGlobals._M_h._M_rehash_policy._M_next_resize;
    readableGlobals._M_h._M_buckets = (__buckets_ptr)0x1;
    readableGlobals._M_h._M_bucket_count = 0;
    readableGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    readableGlobals._M_h._M_element_count._0_4_ = 0x3f800000;
    readableGlobals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    readableGlobals._M_h._M_rehash_policy._4_4_ = 0;
    readableGlobals._M_h._M_rehash_policy._M_next_resize = 0;
    puVar18 = (pMVar16->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar21 = (pMVar16->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar18 != puVar21) {
      do {
        pGVar5 = (puVar18->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (pGVar5->init != (Expression *)0x0) {
          auStack_1d8 = (undefined1  [8])0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep = (Expression **)0x0
          ;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].currp
               = (Expression **)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currFunction =
               (Function *)this->wasm;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currModule = (Module *)this;
          scanner.unfixableGets.Map._M_h._M_buckets = (__buckets_ptr)puVar18;
          scanner.unfixableGets.Map._M_h._M_bucket_count = (size_type)auStack_78;
          wasm::Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                    ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)auStack_1d8,
                     wasm::PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::scan,
                     &pGVar5->init);
          while (((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                  (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                        _M_elems[9].currp >> 4) +
                 (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep != 0) {
            if ((pointer)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[9].currp ==
                scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep ==
                  (Expression **)0x0) {
                pcVar10 = 
                "T &wasm::SmallVector<wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::Task, 10>::back() [T = wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::Task, N = 10]"
                ;
LAB_00142e30:
                __assert_fail("usedFixed > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                              ,0x7e,pcVar10);
              }
              ppEVar17 = scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[(long)scanner.
                                        super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                        .
                                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                        .replacep + -2].currp;
              auStack_1d8 = (undefined1  [8])
                            scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                            fixed._M_elems
                            [(long)scanner.
                                   super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                   super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                   replacep + -1].func;
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep =
                   (Expression **)
                   ((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep + -1
                   );
            }
            else {
              ppEVar17 = (Expression **)
                         scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible
                         .
                         super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].func;
              auStack_1d8 = (undefined1  [8])
                            scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                            flexible.
                            super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].currp;
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                   super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                   super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
            }
            if ((Expression *)(((element_type *)auStack_1d8)->tag).super_IString.str._M_len ==
                (Expression *)0x0) {
              pcVar10 = 
              "void wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::walk(Expression *&) [SubType = InitFixer, VisitorType = wasm::Visitor<InitFixer>]"
              ;
LAB_00142dfa:
              __assert_fail("*task.currp",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                            ,0x132,pcVar10);
            }
            (*(code *)ppEVar17)((InitScanner *)auStack_1d8,(Expression **)auStack_1d8);
          }
          local_90[0] = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)auStack_78;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)auStack_78,
                     (puVar18->_M_t).
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,local_90);
          if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].
              currp != (Expression **)0x0) {
            operator_delete(scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                            fixed._M_elems[9].currp,
                            (long)scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .flexible.
                                  super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .fixed._M_elems[9].currp);
          }
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar21);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_78);
    std::__cxx11::
    _List_base<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>
    ::_M_clear(&local_1f0);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&global.super_IString.str._M_str);
    std::
    vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ::~vector(&local_a8);
  }
  return;
}

Assistant:

void applyToModule() {
    clearApplyState();

    // If nothing was ever written to memories then there is nothing to update.
    if (!memories.empty()) {
      applyMemoryToModule();
    }

    applyGlobalsToModule();
  }